

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Derive.cpp
# Opt level: O2

void __thiscall amrex::DeriveRec::buildBC3D(DeriveRec *this,DescriptorList *d_list)

{
  StateRange *pSVar1;
  int *__s;
  StateDescriptor *this_00;
  BCRec *pBVar2;
  int j;
  long lVar3;
  long lVar4;
  int k;
  int iVar5;
  ulong __n;
  StateRange **ppSVar6;
  
  if (this->bcr3D != (int *)0x0) {
    operator_delete__(this->bcr3D);
  }
  __n = 0xffffffffffffffff;
  if (-1 < (long)this->n_state) {
    __n = (long)this->n_state * 0x18;
  }
  __s = (int *)operator_new__(__n);
  memset(__s,0,__n);
  this->bcr3D = __s;
  ppSVar6 = &this->rng;
  while (pSVar1 = *ppSVar6, pSVar1 != (StateRange *)0x0) {
    this_00 = DescriptorList::operator[](d_list,pSVar1->typ);
    for (iVar5 = 0; iVar5 < pSVar1->nc; iVar5 = iVar5 + 1) {
      pBVar2 = StateDescriptor::getBC(this_00,pSVar1->sc + iVar5);
      for (lVar3 = 0; lVar4 = 3, lVar3 != 3; lVar3 = lVar3 + 1) {
        __s[lVar3] = pBVar2->bc[lVar3];
      }
      for (; lVar4 != 6; lVar4 = lVar4 + 1) {
        __s[lVar4] = pBVar2->bc[lVar4];
      }
      __s = __s + 6;
    }
    ppSVar6 = &pSVar1->next;
  }
  return;
}

Assistant:

void
DeriveRec::buildBC3D (const DescriptorList& d_list)
{
    BL_ASSERT(nsr > 0);
    delete [] bcr3D;
    bcr3D = new int[2*3*n_state]();
    int* bci = bcr3D;
    for (DeriveRec::StateRange* r = rng; r != 0; r = r->next)
    {
        const StateDescriptor& d = d_list[r->typ];

        for (int k = 0; k < r->nc; k++)
        {
            const int* bc = d.getBC(r->sc + k).vect();

            for (int j = 0; j < AMREX_SPACEDIM; j++)
            {
                bci[j] = bc[j];
            }
            bci += 3;
            for (int j = 0; j < AMREX_SPACEDIM; j++)
            {
                bci[j] = bc[AMREX_SPACEDIM+j];
            }
            bci += 3;
        }
    }
}